

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

int main(int argc,char **argv)

{
  size_type sVar1;
  char cVar2;
  string content;
  ifstream ifs;
  string local_248;
  string local_228 [7];
  undefined8 auStack_140 [36];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Ybb language interpreter V0.1",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    do {
      local_228[0]._M_string_length = 0;
      local_228[0].field_2._M_local_buf[0] = '\0';
      local_228[0]._M_dataplus._M_p = (pointer)&local_228[0].field_2;
      cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x10);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)local_228,cVar2);
      sVar1 = local_228[0]._M_string_length;
      if (local_228[0]._M_string_length != 0) {
        runProgram(local_228);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228[0]._M_dataplus._M_p != &local_228[0].field_2) {
        operator_delete(local_228[0]._M_dataplus._M_p,
                        CONCAT71(local_228[0].field_2._M_allocated_capacity._1_7_,
                                 local_228[0].field_2._M_local_buf[0]) + 1);
      }
    } while (sVar1 != 0);
  }
  else {
    std::ifstream::ifstream(local_228,argv[1],_S_in);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"File not found.",0xf);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
      std::ostream::put(-0x68);
      std::ostream::flush();
    }
    else {
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                ((string *)&local_248,
                 *(undefined8 *)
                  ((long)auStack_140 + *(long *)(local_228[0]._M_dataplus._M_p + -0x18)),0xffffffff,
                 0,0xffffffff);
      runProgram(&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
    }
    std::ifstream::~ifstream(local_228);
  }
  return 0;
}

Assistant:

int main(int argc, const char*argv[]) {
    if (argc >= 2){
        std::ifstream ifs(argv[1]);
        if (ifs.is_open()) {
            std::string content((std::istreambuf_iterator<char>(ifs)),
                                (std::istreambuf_iterator<char>()));
            runProgram(content);
        } else{
            std::cout << "File not found." << std::endl;
        }
        return 0;
    }

    std::cout << "Ybb language interpreter V0.1" << std::endl;
    while (true){
        std::string code;
        getline(std::cin, code);
        if (code.empty())
            break;

        runProgram(code);
    }
    return 0;
}